

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basic_endpoint.hpp
# Opt level: O1

void __thiscall
canary::basic_endpoint<canary::raw>::resize(basic_endpoint<canary::raw> *this,size_t n)

{
  system_error *this_00;
  error_code ec;
  
  if (n < 0x19) {
    return;
  }
  this_00 = (system_error *)__cxa_allocate_exception(0x40);
  ec.cat_ = &boost::system::detail::cat_holder<void>::system_category_instance.super_error_category;
  ec.val_ = 0x16;
  ec.failed_ = true;
  ec._5_3_ = 0;
  boost::system::system_error::system_error(this_00,ec);
  __cxa_throw(this_00,&boost::system::system_error::typeinfo,
              boost::system::system_error::~system_error);
}

Assistant:

void resize(std::size_t n)
    {
        if (n > capacity())
        {
            error_code ec{net::error::invalid_argument};
            throw system_error{ec};
        }
    }